

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTable.c
# Opt level: O3

Aig_Obj_t * Aig_TableLookupTwo(Aig_Man_t *p,Aig_Obj_t *pFanin0,Aig_Obj_t *pFanin1)

{
  Aig_Obj_t *pAVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  
  pAVar2 = pFanin0;
  if (pFanin0 != pFanin1) {
    if ((Aig_Obj_t *)((ulong)pFanin1 ^ 1) == pFanin0) {
      pAVar2 = (Aig_Obj_t *)((ulong)p->pConst1 ^ 1);
    }
    else {
      pAVar1 = (Aig_Obj_t *)((ulong)pFanin0 & 0xfffffffffffffffe);
      pAVar4 = p->pConst1;
      if (pAVar4 == pAVar1) {
        pAVar2 = pFanin1;
        if (pAVar1 != pFanin0) {
          pAVar2 = (Aig_Obj_t *)((ulong)pFanin0 | 1);
        }
      }
      else {
        pAVar3 = (Aig_Obj_t *)((ulong)pFanin1 & 0xfffffffffffffffe);
        if (pAVar4 != pAVar3) {
          if ((*(uint *)&pAVar1->field_0x18 & 7) == 1) {
            __assert_fail("Type != AIG_OBJ_AND || !Aig_ObjIsConst1(Aig_Regular(p0))",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                          ,0x15d,
                          "Aig_Obj_t *Aig_ObjCreateGhost(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Aig_Type_t)"
                         );
          }
          if (pFanin1 == (Aig_Obj_t *)0x0) {
            if (pAVar1 == (Aig_Obj_t *)0x0) goto LAB_006d9c39;
            *(ulong *)&(p->Ghost).field_0x18 =
                 *(ulong *)&(p->Ghost).field_0x18 & 0xfffffffffffffff8 | 5;
            pAVar2 = (Aig_Obj_t *)0x0;
            pAVar4 = pFanin0;
          }
          else {
            if ((*(uint *)&pAVar3->field_0x18 & 7) == 1) {
              __assert_fail("p1 == NULL || !Aig_ObjIsConst1(Aig_Regular(p1))",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                            ,0x15e,
                            "Aig_Obj_t *Aig_ObjCreateGhost(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Aig_Type_t)"
                           );
            }
            if (pAVar1 == pAVar3) {
LAB_006d9c39:
              __assert_fail("Type == AIG_OBJ_CI || Aig_Regular(p0) != Aig_Regular(p1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                            ,0x15f,
                            "Aig_Obj_t *Aig_ObjCreateGhost(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Aig_Type_t)"
                           );
            }
            *(ulong *)&(p->Ghost).field_0x18 =
                 *(ulong *)&(p->Ghost).field_0x18 & 0xfffffffffffffff8 | 5;
            pAVar4 = pFanin1;
            if (pAVar1->Id < pAVar3->Id) {
              pAVar2 = pFanin1;
              pAVar4 = pFanin0;
            }
          }
          (p->Ghost).pFanin0 = pAVar4;
          (p->Ghost).pFanin1 = pAVar2;
          pAVar2 = Aig_TableLookup(p,&p->Ghost);
          return pAVar2;
        }
        if (pAVar4 != pFanin1) {
          pAVar2 = (Aig_Obj_t *)((ulong)pAVar4 ^ 1);
        }
      }
    }
  }
  return pAVar2;
}

Assistant:

Aig_Obj_t * Aig_TableLookupTwo( Aig_Man_t * p, Aig_Obj_t * pFanin0, Aig_Obj_t * pFanin1 )
{
    Aig_Obj_t * pGhost;
    // consider simple cases
    if ( pFanin0 == pFanin1 )
        return pFanin0;
    if ( pFanin0 == Aig_Not(pFanin1) )
        return Aig_ManConst0(p);
    if ( Aig_Regular(pFanin0) == Aig_ManConst1(p) )
        return pFanin0 == Aig_ManConst1(p) ? pFanin1 : Aig_ManConst0(p);
    if ( Aig_Regular(pFanin1) == Aig_ManConst1(p) )
        return pFanin1 == Aig_ManConst1(p) ? pFanin0 : Aig_ManConst0(p);
    pGhost = Aig_ObjCreateGhost( p, pFanin0, pFanin1, AIG_OBJ_AND );
    return Aig_TableLookup( p, pGhost );
}